

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_os.h
# Opt level: O0

bool __kmp_atomic_compare_store_acq<int>(atomic<int> *p,int expected,int desired)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  
  LOCK();
  iVar1 = *in_RDI;
  if (in_ESI == iVar1) {
    *in_RDI = in_EDX;
  }
  UNLOCK();
  return in_ESI == iVar1;
}

Assistant:

bool __kmp_atomic_compare_store_acq(std::atomic<T> *p, T expected, T desired) {
  return p->compare_exchange_strong(
      expected, desired, std::memory_order_acquire, std::memory_order_relaxed);
}